

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

tdefl_status
tdefl_init(tdefl_compressor *d,tdefl_put_buf_func_ptr pPut_buf_func,void *pPut_buf_user,int flags)

{
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  *(uint *)(in_RDI + 2) = in_ECX;
  *(uint *)((long)in_RDI + 0x14) = ((in_ECX & 0xfff) + 2) / 3 + 1;
  *(uint *)((long)in_RDI + 0x1c) = (uint)((in_ECX & 0x4000) != 0);
  *(uint *)(in_RDI + 3) = (((int)(in_ECX & 0xfff) >> 2) + 2U) / 3 + 1;
  if ((in_ECX & 0x8000) == 0) {
    memset((void *)((long)in_RDI + 0x292aa),0,0x10000);
  }
  *(undefined4 *)((long)in_RDI + 0x5c) = 0;
  *(undefined4 *)(in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0x54) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x10) = 0;
  *(undefined4 *)(in_RDI + 0xc) = 0;
  *(undefined4 *)((long)in_RDI + 0x7c) = 0;
  *(undefined4 *)(in_RDI + 0xf) = 0;
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  in_RDI[6] = (long)in_RDI + 0x92ab;
  in_RDI[7] = (long)in_RDI + 0x92aa;
  *(undefined4 *)(in_RDI + 10) = 8;
  in_RDI[8] = (long)in_RDI + 0x392aa;
  in_RDI[9] = (long)in_RDI + 0x392aa;
  *(undefined4 *)((long)in_RDI + 0x84) = 0;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  *(undefined4 *)(in_RDI + 0xd) = 0;
  *(undefined4 *)((long)in_RDI + 100) = 0;
  *(undefined4 *)(in_RDI + 4) = 1;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  *(undefined4 *)(in_RDI + 0x15) = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  in_RDI[0x18] = 0;
  if ((in_ECX & 0x8000) == 0) {
    memset(in_RDI + 0x19,0,0x8101);
  }
  memset((void *)((long)in_RDI + 0x81ca),0,0x240);
  memset((void *)((long)in_RDI + 0x840a),0,0x40);
  return TDEFL_STATUS_OKAY;
}

Assistant:

inline tdefl_status tdefl_init(tdefl_compressor* d, tdefl_put_buf_func_ptr pPut_buf_func, void* pPut_buf_user,
                               int flags) {

    d->m_pPut_buf_func = pPut_buf_func;
    d->m_pPut_buf_user = pPut_buf_user;
    d->m_flags = (mz_uint)(flags);
    d->m_max_probes[0] = 1 + ((flags & 0xFFF) + 2) / 3;
    d->m_greedy_parsing = (flags & TDEFL_GREEDY_PARSING_FLAG) != 0;
    d->m_max_probes[1] = 1 + (((flags & 0xFFF) >> 2) + 2) / 3;
    if (!(flags & TDEFL_NONDETERMINISTIC_PARSING_FLAG))
        MZ_CLEAR_OBJ(d->m_hash);
    d->m_lookahead_pos = d->m_lookahead_size = d->m_dict_size = d->m_total_lz_bytes = d->m_lz_code_buf_dict_pos = d
            ->m_bits_in = 0;
    d->m_output_flush_ofs = d->m_output_flush_remaining = d->m_finished = d->m_block_index = d->m_bit_buffer = d
            ->m_wants_to_finish = 0;
    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    d->m_num_flags_left = 8;
    d->m_pOutput_buf = d->m_output_buf;
    d->m_pOutput_buf_end = d->m_output_buf;
    d->m_prev_return_status = TDEFL_STATUS_OKAY;
    d->m_saved_match_dist = d->m_saved_match_len = d->m_saved_lit = 0;
    d->m_adler32 = 1;
    d->m_pIn_buf = NULL;
    d->m_pOut_buf = NULL;
    d->m_pIn_buf_size = NULL;
    d->m_pOut_buf_size = NULL;
    d->m_flush = TDEFL_NO_FLUSH;
    d->m_pSrc = NULL;
    d->m_src_buf_left = 0;
    d->m_out_buf_ofs = 0;
    if (!(flags & TDEFL_NONDETERMINISTIC_PARSING_FLAG))
        MZ_CLEAR_OBJ(d->m_dict);
    memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
    memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);
    return TDEFL_STATUS_OKAY;
}